

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polyline.h
# Opt level: O2

S2Point * __thiscall S2Polyline::vertex(S2Polyline *this,int k)

{
  S2LogMessage SStack_18;
  
  if (k < 0) {
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline.h"
               ,0x72,kFatal,(ostream *)&std::cerr);
    std::operator<<(SStack_18.stream_,"Check failed: (k) >= (0) ");
  }
  else {
    if (k < this->num_vertices_) {
      return (this->vertices_)._M_t.
             super___uniq_ptr_impl<Vector3<double>,_std::default_delete<Vector3<double>[]>_>._M_t.
             super__Tuple_impl<0UL,_Vector3<double>_*,_std::default_delete<Vector3<double>[]>_>.
             super__Head_base<0UL,_Vector3<double>_*,_false>._M_head_impl + (uint)k;
    }
    S2LogMessage::S2LogMessage
              (&SStack_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2polyline.h"
               ,0x73,kFatal,(ostream *)&std::cerr);
    std::operator<<(SStack_18.stream_,"Check failed: (k) < (num_vertices_) ");
  }
  abort();
}

Assistant:

const S2Point& vertex(int k) const {
    S2_DCHECK_GE(k, 0);
    S2_DCHECK_LT(k, num_vertices_);
    return vertices_[k];
  }